

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualsource.cpp
# Opt level: O0

double __thiscall QualSource::getQuality(QualSource *this,Node *node)

{
  int iVar1;
  double *pdVar2;
  Node *node_local;
  QualSource *this_local;
  
  this->quality = node->quality;
  if ((this->outflow != 0.0) || (NAN(this->outflow))) {
    switch(this->type) {
    case 0:
      iVar1 = (*(node->super_Element)._vptr_Element[2])();
      if (iVar1 == 0) {
        if (node->outflow <= 0.0 && node->outflow != 0.0) {
          this->quality = this->strength * (-node->outflow / this->outflow) + this->quality;
        }
      }
      else if (iVar1 == 1) {
        pdVar2 = std::max<double>(&this->quality,&this->strength);
        this->quality = *pdVar2;
      }
      else if (iVar1 == 2) {
        this->quality = this->strength;
      }
      break;
    case 1:
      this->quality = this->strength / this->outflow + this->quality;
      break;
    case 2:
      this->quality = this->strength + this->quality;
      break;
    case 3:
      pdVar2 = std::max<double>(&this->quality,&this->strength);
      this->quality = *pdVar2;
    }
    this_local = (QualSource *)this->quality;
  }
  else {
    this_local = (QualSource *)this->quality;
  }
  return (double)this_local;
}

Assistant:

double QualSource::getQuality(Node* node)
{
    // ... no source contribution if no flow out of node
    quality = node->quality;
    if ( outflow == 0.0 ) return quality;

    switch (type)
    {
    case CONCEN:
        switch (node->type())
        {
        // ... for junctions, outflow quality is the node's quality plus the
        //     source's quality times the fraction of outflow to the network
        //     contributed by external inflow (i.e., negative demand)
        //     NOTE: qualSource.outflow is flow in links leaving the node,
        //           node->outflow is node's external outflow (demands, etc.)
        case Node::JUNCTION:
            if ( node->outflow < 0.0 )
            {
                quality += strength * (-node->outflow / outflow);
            }
            break;

        // ... for tanks, the outflow quality is the larger of the
        //     tank's value and the source's value
        case Node::TANK:
            quality = max(quality, strength);
            break;

        // ... for reservoirs, outflow quality equals the source strength
        case Node::RESERVOIR:
            quality = strength;
            break;
        }
        break;

    case MASS:
        // ... outflow quality is node's quality plus the source's
        //     mass flow rate divided by the node's outflow to the network
        quality += strength / outflow;
        break;

    case SETPOINT:
        // ... outflow quality is larger of node quality and setpoint strength
         quality = max(quality, strength);
        break;

    case FLOWPACED:
        // ... outflow quality is node's quality + source's strength
        quality += strength;
        break;
    }
    return quality;
}